

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkAssignIDs2(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  void **local_38;
  
  Abc_NtkCleanCopy(pNtk);
  for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
    pAVar1 = Abc_NtkCi(pNtk,iVar5);
    (pAVar1->field_6).iTemp = iVar5;
  }
  uVar4 = pNtk->nObjCounts[7];
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  uVar6 = 8;
  if (6 < uVar4 - 1) {
    uVar6 = uVar4;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = uVar6;
  uVar4 = 0;
  if (uVar6 == 0) {
    local_38 = (void **)0x0;
  }
  else {
    local_38 = (void **)malloc((long)(int)uVar6 << 3);
  }
  pVVar2->pArray = local_38;
  for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
    pAVar1 = Abc_NtkObj(pNtk,iVar5);
    if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)) {
      (pAVar1->field_6).iTemp = pNtk->vCis->nSize + uVar4;
      if (uVar4 == uVar6) {
        uVar7 = uVar6 * 2;
        if ((int)uVar6 < 0x10) {
          uVar7 = 0x10;
        }
        if ((int)uVar6 < (int)uVar7) {
          if (local_38 == (void **)0x0) {
            local_38 = (void **)malloc((ulong)uVar7 << 3);
          }
          else {
            local_38 = (void **)realloc(local_38,(ulong)uVar7 << 3);
          }
          pVVar2->pArray = local_38;
          pVVar2->nCap = uVar7;
          uVar6 = uVar7;
        }
      }
      lVar3 = (long)(int)uVar4;
      uVar4 = uVar4 + 1;
      pVVar2->nSize = uVar4;
      local_38[lVar3] = pAVar1;
    }
  }
  if (uVar4 == pNtk->nObjCounts[7]) {
    for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
      pAVar1 = Abc_NtkCo(pNtk,iVar5);
      (pAVar1->field_6).iTemp = iVar5 + uVar4 + pNtk->vCis->nSize;
    }
    return pVVar2;
  }
  __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkNodeNum(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMfs.c"
                ,0x4d,"Vec_Ptr_t *Abc_NtkAssignIDs2(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkAssignIDs2( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = i;
    vNodes = Vec_PtrAlloc( Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes);
        Vec_PtrPush( vNodes, pObj );
    }
    assert( Vec_PtrSize(vNodes) == Abc_NtkNodeNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        pObj->iTemp = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + i;
    return vNodes;
}